

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O2

void __thiscall
AutoArgParse::FlagStore::printUsageHelp(FlagStore *this,ostream *os,IndentedLine *lineIndent)

{
  pointer puVar1;
  ostream *poVar2;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  pointer puVar3;
  
  lineIndent->indentLevel = lineIndent->indentLevel + 1;
  puVar1 = (this->args).
           super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->args).
                super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    if (*(size_type *)
         ((long)&(((puVar3->_M_t).
                   super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                   .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->
                 super_ParseToken).description + 8) != 0) {
      operator<<(os,lineIndent);
      std::operator<<(os,(string *)
                         &((puVar3->_M_t).
                           super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                           .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->
                          name);
      if ((((puVar3->_M_t).
            super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
            .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->super_ParseToken).
          policy == OPTIONAL) {
        std::operator<<(os," [optional]");
      }
      poVar2 = std::operator<<((ostream *)&std::cout,": ");
      std::operator<<(poVar2,(string *)
                             &(((puVar3->_M_t).
                                super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
                                .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)
                              ->super_ParseToken).description);
    }
  }
  AutoArgParse::printUsageHelp(&this->flagInsertionOrder,&this->flags,os,lineIndent);
  lineIndent->indentLevel = lineIndent->indentLevel + -1;
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::printUsageHelp(
    std::ostream& os, IndentedLine& lineIndent) const {
    lineIndent.indentLevel++;
    for (auto& argPtr : args) {
        if (argPtr->description.size() > 0) {
            os << lineIndent;
            os << argPtr->name;
            if (argPtr->policy == Policy::OPTIONAL) {
                os << " [optional]";
            }
            std::cout << ": " << argPtr->description;
        }
    }
    AutoArgParse::printUsageHelp(flagInsertionOrder, flags, os, lineIndent);
    lineIndent.indentLevel--;
}